

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::Split(PageHeap *this,Span *span,Length n)

{
  Span *span_00;
  Span *leftover;
  int extra;
  Length n_local;
  Span *span_local;
  PageHeap *this_local;
  
  span_00 = NewSpan(span->start + n,(long)((int)span->length - (int)n));
  RecordSpan(this,span_00);
  TCMalloc_PageMap2<35>::set(&this->pagemap_,(span->start + n) - 1,span);
  span->length = n;
  return span_00;
}

Assistant:

Span* PageHeap::Split(Span* span, Length n) {
  ASSERT(lock_.IsHeld());
  ASSERT(0 < n);
  ASSERT(n < span->length);
  ASSERT(span->location == Span::IN_USE);
  ASSERT(span->sizeclass == 0);

  const int extra = span->length - n;
  Span* leftover = NewSpan(span->start + n, extra);
  ASSERT(leftover->location == Span::IN_USE);
  RecordSpan(leftover);
  pagemap_.set(span->start + n - 1, span); // Update map from pageid to span
  span->length = n;

  return leftover;
}